

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::FileDescriptorTables::FindNestedSymbol
          (FileDescriptorTables *this,void *parent,string *name)

{
  second_type *psVar1;
  Symbol SVar2;
  char *local_50;
  pair<const_void_*,_const_char_*> local_48;
  Symbol *result;
  string *name_local;
  void *parent_local;
  FileDescriptorTables *this_local;
  anon_union_8_8_13f84498_for_Symbol_2 local_10;
  
  result = (Symbol *)name;
  name_local = (string *)parent;
  parent_local = this;
  local_50 = (char *)std::__cxx11::string::c_str();
  std::pair<const_void_*,_const_char_*>::pair<const_void_*&,_const_char_*,_true>
            (&local_48,&name_local,&local_50);
  psVar1 = FindOrNull<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::Symbol,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::Symbol>>>>
                     (&this->symbols_by_parent_,&local_48);
  if (psVar1 == (second_type *)0x0) {
    this_local = (anonymous_namespace)::kNullSymbol;
    local_10 = DAT_006fe340;
  }
  else {
    this_local = *(FileDescriptorTables **)psVar1;
    local_10 = (anon_union_8_8_13f84498_for_Symbol_2)(psVar1->field_1).descriptor;
  }
  SVar2._0_8_ = (ulong)this_local & 0xffffffff;
  SVar2.field_1.descriptor = local_10.descriptor;
  return SVar2;
}

Assistant:

inline Symbol FileDescriptorTables::FindNestedSymbol(
    const void* parent, const string& name) const {
  const Symbol* result =
    FindOrNull(symbols_by_parent_, PointerStringPair(parent, name.c_str()));
  if (result == NULL) {
    return kNullSymbol;
  } else {
    return *result;
  }
}